

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock-posix.c
# Opt level: O0

PRWLock * p_rwlock_new(void)

{
  int iVar1;
  PRWLock *ret;
  
  ret = (PRWLock *)p_malloc0(0x38);
  if ((pthread_rwlock_t *)ret == (pthread_rwlock_t *)0x0) {
    printf("** Error: %s **\n","PRWLock::p_rwlock_new: failed to allocate memory");
    ret = (PRWLock *)0x0;
  }
  else {
    iVar1 = pthread_rwlock_init((pthread_rwlock_t *)ret,(pthread_rwlockattr_t *)0x0);
    if (iVar1 != 0) {
      printf("** Error: %s **\n","PRWLock::p_rwlock_new: pthread_rwlock_init() failed");
      p_free(ret);
      ret = (PRWLock *)0x0;
    }
  }
  return ret;
}

Assistant:

P_LIB_API PRWLock *
p_rwlock_new (void)
{
	PRWLock *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PRWLock))) == NULL)) {
		P_ERROR ("PRWLock::p_rwlock_new: failed to allocate memory");
		return NULL;
	}

	if (P_UNLIKELY (pthread_rwlock_init (&ret->hdl, NULL) != 0)) {
		P_ERROR ("PRWLock::p_rwlock_new: pthread_rwlock_init() failed");
		p_free (ret);
		return NULL;
	}

	return ret;
}